

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * prepend_alloc(mstate m,char *newbase,char *oldbase,size_t nb)

{
  mchunkptr pmVar1;
  ulong uVar2;
  malloc_tree_chunk *pmVar3;
  malloc_tree_chunk *pmVar4;
  tbinptr pmVar5;
  tbinptr pmVar6;
  malloc_chunk *pmVar7;
  malloc_chunk *pmVar8;
  byte bVar9;
  uint uVar10;
  malloc_tree_chunk **ppmVar11;
  malloc_chunk *pmVar12;
  ulong uVar13;
  uint uVar14;
  tbinptr pmVar15;
  long lVar16;
  ulong uVar17;
  long *plVar18;
  tbinptr pmVar19;
  
  uVar17 = (ulong)(-(int)newbase - 0x10U & 0xf);
  pmVar15 = (tbinptr)(oldbase + (-(int)oldbase - 0x10U & 0xf));
  pmVar1 = (mchunkptr)(newbase + nb + uVar17);
  uVar13 = (long)pmVar15 - (long)pmVar1;
  *(size_t *)(newbase + uVar17 + 8) = nb | 3;
  if (pmVar15 == (tbinptr)m->top) {
    uVar13 = uVar13 + m->topsize;
    m->topsize = uVar13;
    m->top = pmVar1;
    pmVar1->head = uVar13 | 1;
    goto LAB_001048de;
  }
  if (pmVar15 == (tbinptr)m->dv) {
    uVar13 = uVar13 + m->dvsize;
    m->dvsize = uVar13;
    m->dv = pmVar1;
    pmVar1->head = uVar13 | 1;
    *(ulong *)((long)pmVar1 + uVar13) = uVar13;
    goto LAB_001048de;
  }
  uVar2 = pmVar15->head;
  if (((uint)uVar2 & 3) == 1) {
    if (0xff < uVar2) {
      pmVar19 = pmVar15->bk;
      pmVar3 = pmVar15->child[2];
      if (pmVar19 == pmVar15) {
        pmVar19 = pmVar15->child[1];
        if (pmVar19 != (tbinptr)0x0) {
          ppmVar11 = pmVar15->child + 1;
LAB_0010468c:
          do {
            if (pmVar19->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar19->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x001046a0;
              ppmVar11 = pmVar19->child;
            }
            else {
              ppmVar11 = pmVar19->child + 1;
            }
            pmVar19 = *ppmVar11;
          } while( true );
        }
        pmVar19 = pmVar15->child[0];
        if (pmVar19 != (tbinptr)0x0) {
          ppmVar11 = pmVar15->child;
          goto LAB_0010468c;
        }
        pmVar19 = (tbinptr)0x0;
      }
      else {
        pmVar4 = pmVar15->fd;
        if (((pmVar4 < (malloc_tree_chunk *)m->least_addr) || (pmVar4->bk != pmVar15)) ||
           (pmVar19->fd != pmVar15)) goto LAB_001048ec;
        pmVar4->bk = pmVar19;
        pmVar19->fd = pmVar4;
      }
      goto LAB_001046b1;
    }
    pmVar3 = pmVar15->fd;
    pmVar4 = pmVar15->bk;
    if ((pmVar3 != (malloc_tree_chunk *)(m->smallbins + (uVar2 >> 3) * 2)) &&
       ((pmVar3 < (malloc_tree_chunk *)m->least_addr || (pmVar3->bk != pmVar15))))
    goto LAB_001048ec;
    if (pmVar4 == pmVar3) {
      bVar9 = (byte)(uVar2 >> 3) & 0x1f;
      m->smallmap = m->smallmap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
    }
    else {
      if ((pmVar4 != (malloc_tree_chunk *)(m->smallbins + (uVar2 >> 3) * 2)) &&
         ((pmVar4 < (malloc_tree_chunk *)m->least_addr || (pmVar4->fd != pmVar15))))
      goto LAB_001048ec;
      pmVar3->bk = pmVar4;
      pmVar4->fd = pmVar3;
    }
    goto LAB_00104746;
  }
  goto LAB_00104750;
code_r0x001046a0:
  if (ppmVar11 < m->least_addr) goto LAB_001048ec;
  *ppmVar11 = (malloc_tree_chunk *)0x0;
LAB_001046b1:
  if (pmVar3 != (malloc_tree_chunk *)0x0) {
    uVar14 = *(uint *)(pmVar15->child + 3);
    if (pmVar15 == m->treebins[uVar14]) {
      m->treebins[uVar14] = pmVar19;
      if (pmVar19 == (tbinptr)0x0) {
        bVar9 = (byte)uVar14 & 0x1f;
        m->treemap = m->treemap & (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
        goto LAB_001046fb;
      }
    }
    else {
      if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001048ec;
      if (pmVar3->child[0] == pmVar15) {
        pmVar3->child[0] = pmVar19;
      }
      else {
        pmVar3->child[1] = pmVar19;
      }
LAB_001046fb:
      if (pmVar19 == (tbinptr)0x0) goto LAB_00104746;
    }
    pmVar5 = (tbinptr)m->least_addr;
    if (pmVar19 < pmVar5) goto LAB_001048ec;
    pmVar19->child[2] = pmVar3;
    pmVar6 = pmVar15->child[0];
    if (pmVar6 != (tbinptr)0x0) {
      if (pmVar6 < pmVar5) goto LAB_001048ec;
      pmVar19->child[0] = pmVar6;
      pmVar6->child[2] = pmVar19;
    }
    pmVar3 = pmVar15->child[1];
    if (pmVar3 != (malloc_tree_chunk *)0x0) {
      if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001048ec;
      pmVar19->child[1] = pmVar3;
      pmVar3->parent = pmVar19;
    }
  }
LAB_00104746:
  pmVar15 = (tbinptr)((long)pmVar15->child + ((uVar2 & 0xfffffffffffffff8) - 0x20));
  uVar13 = uVar13 + (uVar2 & 0xfffffffffffffff8);
LAB_00104750:
  *(byte *)&pmVar15->head = (byte)pmVar15->head & 0xfe;
  pmVar1->head = uVar13 | 1;
  *(ulong *)((long)&pmVar1->prev_foot + uVar13) = uVar13;
  if (uVar13 < 0x100) {
    uVar13 = uVar13 >> 3;
    if ((m->smallmap >> ((uint)uVar13 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << ((byte)uVar13 & 0x1f);
      pmVar12 = (malloc_chunk *)(m->smallbins + uVar13 * 2);
    }
    else {
      pmVar12 = m->smallbins[uVar13 * 2 + 2];
      if (m->smallbins[uVar13 * 2 + 2] < (malloc_chunk *)m->least_addr) {
LAB_001048ec:
        abort();
      }
    }
    m->smallbins[uVar13 * 2 + 2] = pmVar1;
    pmVar12->bk = pmVar1;
    pmVar1->fd = pmVar12;
    pmVar1->bk = (malloc_chunk *)(m->smallbins + uVar13 * 2);
  }
  else {
    uVar14 = (uint)(uVar13 >> 8);
    if (uVar14 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0x1f;
      if (uVar14 < 0x10000) {
        uVar10 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar10 = (uint)((uVar13 >> ((ulong)(byte)(0x26 - (char)(uVar10 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar10 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar12 = (malloc_chunk *)(m->treebins + uVar10);
    *(uint *)&pmVar1[1].bk = uVar10;
    pmVar1[1].prev_foot = 0;
    pmVar1[1].head = 0;
    if ((m->treemap >> (uVar10 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << ((byte)uVar10 & 0x1f);
      pmVar12->prev_foot = (size_t)pmVar1;
      pmVar1[1].fd = pmVar12;
      pmVar1->bk = pmVar1;
      pmVar1->fd = pmVar1;
    }
    else {
      pmVar12 = (malloc_chunk *)pmVar12->prev_foot;
      bVar9 = 0x39 - (char)(uVar10 >> 1);
      if (uVar10 == 0x1f) {
        bVar9 = 0;
      }
      lVar16 = uVar13 << (bVar9 & 0x3f);
      do {
        if ((pmVar12->head & 0xfffffffffffffff8) == uVar13) {
          if ((pmVar12 < (malloc_chunk *)m->least_addr) ||
             (pmVar7 = pmVar12->fd, pmVar7 < (malloc_chunk *)m->least_addr)) goto LAB_001048ec;
          pmVar7->bk = pmVar1;
          pmVar12->fd = pmVar1;
          pmVar1->fd = pmVar7;
          pmVar1->bk = pmVar12;
          pmVar1[1].fd = (malloc_chunk *)0x0;
          break;
        }
        pmVar7 = *(malloc_chunk **)((long)pmVar12 + (lVar16 >> 0x3f) * -8 + 0x20);
        pmVar8 = pmVar7;
        if (pmVar7 == (malloc_chunk *)0x0) {
          plVar18 = (long *)((long)pmVar12 + (lVar16 >> 0x3f) * -8 + 0x20);
          if (plVar18 < m->least_addr) goto LAB_001048ec;
          *plVar18 = (long)pmVar1;
          pmVar1[1].fd = pmVar12;
          pmVar1->bk = pmVar1;
          pmVar1->fd = pmVar1;
          pmVar8 = pmVar12;
        }
        pmVar12 = pmVar8;
        lVar16 = lVar16 * 2;
      } while (pmVar7 != (malloc_chunk *)0x0);
    }
  }
LAB_001048de:
  return newbase + uVar17 + 0x10;
}

Assistant:

static void* prepend_alloc(mstate m, char* newbase, char* oldbase,
                           size_t nb) {
  mchunkptr p = align_as_chunk(newbase);
  mchunkptr oldfirst = align_as_chunk(oldbase);
  size_t psize = (char*)oldfirst - (char*)p;
  mchunkptr q = chunk_plus_offset(p, nb);
  size_t qsize = psize - nb;
  set_size_and_pinuse_of_inuse_chunk(m, p, nb);

  assert((char*)oldfirst > (char*)q);
  assert(pinuse(oldfirst));
  assert(qsize >= MIN_CHUNK_SIZE);

  /* consolidate remainder with first chunk of old base */
  if (oldfirst == m->top) {
    size_t tsize = m->topsize += qsize;
    m->top = q;
    q->head = tsize | PINUSE_BIT;
    check_top_chunk(m, q);
  }
  else if (oldfirst == m->dv) {
    size_t dsize = m->dvsize += qsize;
    m->dv = q;
    set_size_and_pinuse_of_free_chunk(q, dsize);
  }
  else {
    if (!is_inuse(oldfirst)) {
      size_t nsize = chunksize(oldfirst);
      unlink_chunk(m, oldfirst, nsize);
      oldfirst = chunk_plus_offset(oldfirst, nsize);
      qsize += nsize;
    }
    set_free_with_pinuse(q, qsize, oldfirst);
    insert_chunk(m, q, qsize);
    check_free_chunk(m, q);
  }

  check_malloced_chunk(m, chunk2mem(p), nb);
  return chunk2mem(p);
}